

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

void CheckWasmMathException(int exceptionCode,ExceptionFilterHelper *helper)

{
  bool bVar1;
  int32 hCode;
  ScriptFunction *this;
  FunctionBody *this_00;
  ScriptContext *scriptContext;
  int32 code;
  FunctionBody *funcBody;
  ScriptFunction *func;
  ExceptionFilterHelper *helper_local;
  int exceptionCode_local;
  
  if ((((DAT_01e9e23f & 1) != 0) &&
      (((exceptionCode == -0x3fffff6c || (exceptionCode == -0x3fffff6b)) &&
       (this = ExceptionFilterHelper::GetScriptFunction(helper), this != (ScriptFunction *)0x0))))
     && ((this_00 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)this),
         this_00 != (FunctionBody *)0x0 &&
         (bVar1 = Js::ParseableFunctionInfo::IsWasmFunction(&this_00->super_ParseableFunctionInfo),
         bVar1)))) {
    hCode = -0x7ff5fffa;
    if (exceptionCode == -0x3fffff6c) {
      hCode = -0x7ff5e49e;
    }
    scriptContext = Js::RecyclableObject::GetScriptContext((RecyclableObject *)this);
    Js::JavascriptError::ThrowWebAssemblyRuntimeError(scriptContext,hCode,(PCWSTR)0x0);
  }
  return;
}

Assistant:

void CheckWasmMathException(int exceptionCode, ExceptionFilterHelper& helper)
    {
        if (CONFIG_FLAG(WasmMathExFilter) && (exceptionCode == STATUS_INTEGER_DIVIDE_BY_ZERO || exceptionCode == STATUS_INTEGER_OVERFLOW))
        {
            Js::ScriptFunction* func = helper.GetScriptFunction();
            if (func)
            {
                Js::FunctionBody* funcBody = func->GetFunctionBody();
                if (funcBody && funcBody->IsWasmFunction())
                {
                    int32 code = exceptionCode == STATUS_INTEGER_DIVIDE_BY_ZERO ? WASMERR_DivideByZero : VBSERR_Overflow;
                    JavascriptError::ThrowWebAssemblyRuntimeError(func->GetScriptContext(), code);
                }
            }
        }
    }